

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall
ON_SubDimple::IsValidLevel
          (ON_SubDimple *this,ON_SubD *subd,uint level_index,bool bSilentError,ON_TextLog *text_log)

{
  ON_SubDEdgeTag OVar1;
  char cVar2;
  ushort uVar3;
  ON_SubDLevel *this_00;
  element_type *peVar4;
  ON_SubDVertex *pOVar5;
  ON_SubDEdge *edge;
  ON_SubDFace *face;
  double dVar6;
  unsigned_short level;
  bool bVar7;
  ON_SubDVertex **ppOVar8;
  ON_SubDFacePtr *pOVar9;
  ON_SubDEdgePtr *pOVar10;
  ON_SubDVertex *pOVar11;
  ushort uVar12;
  int iVar13;
  ON_SubDLevel *pOVar14;
  ON_SubDEdge **ppOVar15;
  ON_SubDFace **ppOVar16;
  byte extraout_DL;
  ushort uVar17;
  int iVar18;
  int iVar19;
  ON_TextLog *pOVar20;
  ON_SubDEdge *pOVar21;
  ON__UINT_PTR OVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  undefined1 bSilentError_00;
  ulong uVar28;
  ON_SubDEdgePtr *pOVar29;
  ON_SubDFacePtr *pOVar30;
  ON_SubDFace *pOVar31;
  ON_SubDVertex **local_c0;
  ON_SubDFace **local_b0;
  ON_SubDVertex **local_a8;
  ON_SubDEdge **local_98;
  uint f_id_range [2];
  uint e_id_range [2];
  uint v_id_range [2];
  ON_SubDVertexIterator vit;
  
  pOVar20 = (ON_TextLog *)(ulong)bSilentError;
  if ((((0xfffe < level_index) || ((uint)(this->m_levels).m_count <= level_index)) ||
      (this_00 = (this->m_levels).m_a[level_index], this_00 == (ON_SubDLevel *)0x0)) ||
     (ON_SubDLevel::ClearComponentDamagedState(this_00), this_00->m_level_index != level_index)) {
LAB_005d57bc:
    bVar7 = ON_SubDIsNotValid(bSilentError);
    return bVar7;
  }
  if (level_index == 0) {
    if (((this_00->m_vertex_count < 3) || (this_00->m_edge_count < 3)) ||
       (this_00->m_face_count == 0)) goto LAB_005d57bc;
  }
  else {
    pOVar14 = (this->m_levels).m_a[(ulong)level_index - 1];
    if (((pOVar14 == (ON_SubDLevel *)0x0) || (this_00->m_vertex_count <= pOVar14->m_vertex_count))
       || ((this_00->m_edge_count <= pOVar14->m_edge_count ||
           (this_00->m_face_count <= pOVar14->m_face_count)))) goto LAB_005d57bc;
  }
  if (((((this_00->m_vertex[0] == (ON_SubDVertex *)0x0) ||
        (this_00->m_edge[0] == (ON_SubDEdge *)0x0)) || (this_00->m_face[0] == (ON_SubDFace *)0x0))
      || ((this_00->m_vertex[1] == (ON_SubDVertex *)0x0 ||
          (this_00->m_edge[1] == (ON_SubDEdge *)0x0)))) ||
     (this_00->m_face[1] == (ON_SubDFace *)0x0)) goto LAB_005d57bc;
  v_id_range[0] = 0xffffffff;
  v_id_range[1] = 0xffffffff;
  e_id_range[0] = 0xffffffff;
  e_id_range[1] = 0xffffffff;
  f_id_range[0] = 0xffffffff;
  f_id_range[1] = 0xffffffff;
  local_a8 = this_00->m_vertex;
  peVar4 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar4 == (element_type *)0x0) ||
     (pOVar14 = peVar4->m_active_level, pOVar14 == (ON_SubDLevel *)0x0)) {
    pOVar14 = &ON_SubDLevel::Empty;
  }
  local_c0._0_1_ = extraout_DL;
  if (pOVar14->m_level_index == level_index) {
    if (pOVar14->m_vertex[0] != this_00->m_vertex[0]) goto LAB_005d57bc;
    ON_SubDVertexIterator::ON_SubDVertexIterator(&vit,subd);
    pOVar5 = vit.m_v_first;
    vit.m_vertex_index = 0;
    vit.m_v_current = vit.m_v_first;
    pOVar11 = *local_a8;
    local_c0 = local_a8;
    if (vit.m_v_first != pOVar11) {
      bVar7 = ON_SubDIsNotValid(bSilentError);
      local_c0 = (ON_SubDVertex **)(ulong)bVar7;
    }
    ON_SubDRef::~ON_SubDRef(&vit.m_subd_ref);
    if (pOVar5 != pOVar11) goto LAB_005d6070;
  }
  local_98 = this_00->m_edge;
  local_b0 = this_00->m_face;
  uVar23 = 0;
  level = (unsigned_short)level_index;
  iVar18 = 0;
  ppOVar8 = local_a8;
  pOVar11 = (ON_SubDVertex *)0x0;
  while( true ) {
    pOVar5 = *ppOVar8;
    if ((this_00->m_vertex_count <= uVar23) || (pOVar5 == (ON_SubDVertex *)0x0)) break;
    bVar7 = IsValidSubDVertex(pOVar5,level,(uint *)0x0,(ushort)bSilentError,SUB81(text_log,0));
    if (!bVar7) goto LAB_005d6067;
    uVar25 = (pOVar5->super_ON_SubDComponentBase).m_id;
    if (uVar23 == 0) {
      v_id_range = (uint  [2])((ulong)uVar25 << 0x20);
LAB_005d58af:
      v_id_range[0] = uVar25;
    }
    else {
      if (uVar25 < v_id_range[0]) goto LAB_005d58af;
      if (v_id_range[1] < uVar25) {
        v_id_range[1] = uVar25;
      }
    }
    iVar18 = iVar18 + (uint)(pOVar5->m_edge_count == 0);
    uVar23 = uVar23 + 1;
    ppOVar8 = &pOVar5->m_next_vertex;
    pOVar11 = pOVar5;
  }
  if ((this_00->m_vertex[1] == pOVar11) &&
     (uVar23 == this_00->m_vertex_count && pOVar5 == (ON_SubDVertex *)0x0)) {
    if (((uVar23 <= (v_id_range[1] - v_id_range[0]) + 1) &&
        (v_id_range[1] <= (this->m_heap).m_max_vertex_id)) && (iVar18 == 0)) {
      peVar4 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((peVar4 == (element_type *)0x0) ||
         (pOVar14 = peVar4->m_active_level, pOVar14 == (ON_SubDLevel *)0x0)) {
        pOVar14 = &ON_SubDLevel::Empty;
      }
      if (pOVar14->m_level_index == level_index) {
        if (pOVar14->m_edge[0] != *local_98) goto LAB_005d58fa;
        ON_SubDEdgeIterator::ON_SubDEdgeIterator((ON_SubDEdgeIterator *)&vit,subd);
        pOVar5 = vit.m_v_first;
        vit.m_vertex_index = 0;
        vit.m_v_current = vit.m_v_first;
        pOVar11 = (ON_SubDVertex *)*local_98;
        if (vit.m_v_first != pOVar11) {
          local_c0._0_1_ = ON_SubDIsNotValid(bSilentError);
        }
        ON_SubDRef::~ON_SubDRef(&vit.m_subd_ref);
        if (pOVar5 != pOVar11) goto LAB_005d6070;
      }
      uVar23 = 0;
      ppOVar15 = local_98;
      pOVar21 = (ON_SubDEdge *)0x0;
      while( true ) {
        edge = *ppOVar15;
        if ((this_00->m_edge_count <= uVar23) || (edge == (ON_SubDEdge *)0x0)) break;
        bVar7 = IsValidSubDEdge(edge,level,(uint *)0x0,bSilentError);
        if (!bVar7) goto LAB_005d6067;
        uVar25 = (edge->super_ON_SubDComponentBase).m_id;
        if (uVar23 == 0) {
          e_id_range = (uint  [2])((ulong)uVar25 << 0x20);
LAB_005d59e6:
          e_id_range[0] = uVar25;
        }
        else {
          if (uVar25 < e_id_range[0]) goto LAB_005d59e6;
          if (e_id_range[1] < uVar25) {
            e_id_range[1] = uVar25;
          }
        }
        uVar23 = uVar23 + 1;
        ppOVar15 = &edge->m_next_edge;
        pOVar21 = edge;
      }
      if (uVar23 == this_00->m_edge_count && edge == (ON_SubDEdge *)0x0) {
        if (((uVar23 <= (e_id_range[1] - e_id_range[0]) + 1) && (this_00->m_edge[1] == pOVar21)) &&
           (e_id_range[1] <= (this->m_heap).m_max_edge_id)) {
          peVar4 = (subd->m_subdimple_sp).
                   super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar4 == (element_type *)0x0) ||
             (pOVar14 = peVar4->m_active_level, pOVar14 == (ON_SubDLevel *)0x0)) {
            pOVar14 = &ON_SubDLevel::Empty;
          }
          if (pOVar14->m_level_index == level_index) {
            if (pOVar14->m_face[0] != *local_b0) goto LAB_005d58fa;
            ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)&vit,subd);
            vit.m_vertex_index = 0;
            vit.m_v_current = vit.m_v_first;
            pOVar11 = (ON_SubDVertex *)*local_b0;
            if (vit.m_v_first != pOVar11) {
              local_c0._0_1_ = ON_SubDIsNotValid(bSilentError);
            }
            ON_SubDRef::~ON_SubDRef(&vit.m_subd_ref);
            if (vit.m_v_first != pOVar11) goto LAB_005d6070;
          }
          uVar23 = 0;
          ppOVar16 = local_b0;
          pOVar31 = (ON_SubDFace *)0x0;
          while( true ) {
            face = *ppOVar16;
            if ((this_00->m_face_count <= uVar23) || (face == (ON_SubDFace *)0x0)) break;
            local_c0._0_1_ = 0;
            bVar7 = IsValidSubDFace(face,level,(uint *)0x0,(ushort)bSilentError,SUB81(text_log,0));
            if (!bVar7) goto LAB_005d6070;
            uVar25 = (face->super_ON_SubDComponentBase).m_id;
            if (uVar23 == 0) {
              f_id_range = (uint  [2])((ulong)uVar25 << 0x20);
LAB_005d5b1f:
              f_id_range[0] = uVar25;
            }
            else {
              if (uVar25 < f_id_range[0]) goto LAB_005d5b1f;
              if (f_id_range[1] < uVar25) {
                f_id_range[1] = uVar25;
              }
            }
            uVar23 = uVar23 + 1;
            ppOVar16 = &face->m_next_face;
            pOVar31 = face;
          }
          if (uVar23 == this_00->m_face_count && face == (ON_SubDFace *)0x0) {
            if (((uVar23 <= (f_id_range[1] - f_id_range[0]) + 1) && (this_00->m_face[1] == pOVar31))
               && (f_id_range[1] <= (this->m_heap).m_max_face_id)) {
              ppOVar8 = local_a8;
              while (pOVar11 = *ppOVar8, pOVar11 != (ON_SubDVertex *)0x0) {
                uVar28 = 0;
                while (uVar28 < pOVar11->m_edge_count) {
                  pOVar21 = (ON_SubDEdge *)(pOVar11->m_edges[uVar28].m_ptr & 0xfffffffffffffff8);
                  bVar7 = IsValidSubDEdge(pOVar21,level,e_id_range,bSilentError);
                  if (!bVar7) goto LAB_005d6067;
                  if (uVar28 < pOVar11->m_edge_count) {
                    OVar22 = (ON__UINT_PTR)((uint)pOVar11->m_edges[uVar28].m_ptr & 1);
                  }
                  else {
                    OVar22 = 0;
                  }
                  bVar7 = IsValidVertexEdgeLink(pOVar11,pOVar21,OVar22,bSilentError);
                  uVar28 = uVar28 + 1;
                  local_c0._0_1_ = 0;
                  if (!bVar7) goto LAB_005d6070;
                }
                uVar28 = 0;
                while (uVar28 < pOVar11->m_face_count) {
                  pOVar31 = pOVar11->m_faces[uVar28];
                  bVar7 = IsValidSubDFace(pOVar31,level,f_id_range,(ushort)bSilentError,
                                          SUB81(text_log,0));
                  if (!bVar7) goto LAB_005d6067;
                  text_log = pOVar20;
                  bVar7 = IsValidVertexFaceLink
                                    (pOVar11,pOVar31,(uint)uVar28,0xffffffff,bSilentError);
                  uVar28 = uVar28 + 1;
                  local_c0._0_1_ = 0;
                  if (!bVar7) goto LAB_005d6070;
                }
                ppOVar8 = &pOVar11->m_next_vertex;
              }
              ppOVar15 = local_98;
              while (pOVar21 = *ppOVar15, pOVar21 != (ON_SubDEdge *)0x0) {
                OVar22 = 0;
                while (OVar22 != 2) {
                  pOVar11 = pOVar21->m_vertex[OVar22];
                  bVar7 = IsValidSubDVertex(pOVar11,level,v_id_range,(ushort)bSilentError,
                                            SUB81(text_log,0));
                  if (!bVar7) goto LAB_005d6067;
                  bVar7 = IsValidVertexEdgeLink(pOVar11,pOVar21,OVar22,bSilentError);
                  OVar22 = OVar22 + 1;
                  local_c0._0_1_ = 0;
                  if (!bVar7) goto LAB_005d6070;
                }
                pOVar30 = pOVar21->m_face2;
                uVar28 = 0;
                while (uVar28 < pOVar21->m_face_count) {
                  pOVar9 = pOVar30;
                  if (1 < uVar28) {
                    pOVar9 = pOVar21->m_facex + (uVar28 - 2);
                  }
                  pOVar31 = (ON_SubDFace *)(pOVar9->m_ptr & 0xfffffffffffffff8);
                  bVar7 = IsValidSubDFace(pOVar31,level,f_id_range,(ushort)bSilentError,
                                          SUB81(text_log,0));
                  if (!bVar7) goto LAB_005d6067;
                  text_log = pOVar20;
                  bVar7 = IsValidEdgeFaceLink(pOVar21,pOVar31,(uint)uVar28,0xffffffff,bSilentError);
                  uVar28 = uVar28 + 1;
                  pOVar30 = pOVar30 + 1;
                  local_c0._0_1_ = 0;
                  if (!bVar7) goto LAB_005d6070;
                }
                ppOVar15 = &pOVar21->m_next_edge;
              }
              while (pOVar31 = *local_b0, pOVar31 != (ON_SubDFace *)0x0) {
                pOVar29 = pOVar31->m_edge4;
                uVar28 = 0;
                while (uVar28 < pOVar31->m_edge_count) {
                  pOVar10 = pOVar29;
                  if (3 < uVar28) {
                    pOVar10 = pOVar31->m_edgex + (uVar28 - 4);
                  }
                  pOVar21 = (ON_SubDEdge *)(pOVar10->m_ptr & 0xfffffffffffffff8);
                  bVar7 = IsValidSubDEdge(pOVar21,level,e_id_range,bSilentError);
                  if (!bVar7) goto LAB_005d6067;
                  text_log = pOVar20;
                  bVar7 = IsValidEdgeFaceLink(pOVar21,pOVar31,0xffffffff,(uint)uVar28,bSilentError);
                  uVar28 = uVar28 + 1;
                  pOVar29 = pOVar29 + 1;
                  local_c0._0_1_ = 0;
                  if (!bVar7) goto LAB_005d6070;
                }
                uVar23 = 0;
                while (bSilentError_00 = SUB81(text_log,0), uVar23 < pOVar31->m_edge_count) {
                  pOVar11 = ON_SubDFace::Vertex(pOVar31,uVar23);
                  bVar7 = IsValidSubDVertex(pOVar11,level,v_id_range,(ushort)bSilentError,
                                            (bool)bSilentError_00);
                  if (!bVar7) goto LAB_005d6067;
                  text_log = pOVar20;
                  bVar7 = IsValidVertexFaceLink(pOVar11,pOVar31,0xffffffff,uVar23,bSilentError);
                  uVar23 = uVar23 + 1;
                  local_c0._0_1_ = 0;
                  if (!bVar7) goto LAB_005d6070;
                }
                local_b0 = &pOVar31->m_next_face;
              }
              ppOVar15 = local_98;
              while (pOVar21 = *ppOVar15, pOVar21 != (ON_SubDEdge *)0x0) {
                iVar24 = 0;
                iVar13 = 0;
                iVar19 = 0;
                iVar18 = 0;
                for (lVar26 = 0x10; lVar26 != 0x12; lVar26 = lVar26 + 1) {
                  dVar6 = (pOVar21->super_ON_SubDComponentBase).m_saved_subd_point1[lVar26 + -3];
                  if (dVar6 == 0.0) goto LAB_005d5f25;
                  switch(*(undefined1 *)((long)dVar6 + 0x60)) {
                  case 1:
                    iVar18 = iVar18 + 1;
                    break;
                  case 2:
                    iVar24 = iVar24 + 1;
                    break;
                  case 3:
                    iVar13 = iVar13 + 1;
                    break;
                  case 4:
                    iVar19 = iVar19 + 1;
                  }
                }
                if (iVar19 + iVar18 + iVar13 + iVar24 == 2) {
                  OVar1 = pOVar21->m_edge_tag;
                  if (OVar1 == Smooth) {
                    if (iVar18 != 0) {
LAB_005d5eef:
                      if (pOVar21->m_face_count == 2) {
LAB_005d5ef7:
                        vit.m_subd_ref.m_subd_sp.
                        super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)0x0;
                        ON_Internal_DamagedMarker::~ON_Internal_DamagedMarker
                                  ((ON_Internal_DamagedMarker *)&vit);
                        goto LAB_005d5f25;
                      }
                    }
                  }
                  else if (OVar1 == Crease) {
                    if (iVar18 == 0) goto LAB_005d5ef7;
                  }
                  else if ((OVar1 == SmoothX) && (iVar18 == 0)) goto LAB_005d5eef;
                  vit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)pOVar21;
                  bVar7 = ON_SubDIsNotValid(bSilentError);
                  ON_Internal_DamagedMarker::~ON_Internal_DamagedMarker
                            ((ON_Internal_DamagedMarker *)&vit);
                  if (!bVar7) goto LAB_005d6067;
                }
LAB_005d5f25:
                ppOVar15 = &pOVar21->m_next_edge;
              }
              while (pOVar11 = *local_a8, pOVar11 != (ON_SubDVertex *)0x0) {
                uVar3 = pOVar11->m_edge_count;
                uVar17 = 0;
                uVar12 = 0;
                for (uVar28 = 0; uVar3 != uVar28; uVar28 = uVar28 + 1) {
                  uVar27 = pOVar11->m_edges[uVar28].m_ptr & 0xfffffffffffffff8;
                  if (uVar27 != 0) {
                    cVar2 = *(char *)(uVar27 + 0x60);
                    if ((cVar2 == '\x04') || (cVar2 == '\x01')) {
                      uVar17 = uVar17 + 1;
                    }
                    else {
                      uVar12 = uVar12 + (cVar2 == '\x02');
                    }
                  }
                }
                if (pOVar11->m_vertex_tag - 1 < 4) {
                  uVar25 = (uint)uVar17 + (uint)uVar12;
                  uVar23 = (uint)uVar3;
                  switch((uint)pOVar11->m_vertex_tag) {
                  case 1:
                    if (uVar25 == uVar3) {
                      if ((uVar12 == 0 && uVar17 == uVar3) && 1 < uVar3) {
LAB_005d602b:
                        if (uVar3 == pOVar11->m_face_count) break;
                      }
                      goto LAB_005d6046;
                    }
                    break;
                  case 2:
                    if (uVar25 == uVar23 && uVar12 != 2) goto LAB_005d6046;
                    break;
                  case 3:
                    if ((uVar25 == uVar23) &&
                       ((uVar12 == 0 ||
                        ((uVar12 == 1 && ((uVar23 != 1 || (pOVar11->m_face_count != 0))))))))
                    goto LAB_005d6046;
                    break;
                  case 4:
                    if (uVar25 == uVar23) {
                      if ((1 < uVar3) && (uVar12 == 1)) goto LAB_005d602b;
                      goto LAB_005d6046;
                    }
                  }
                  vit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  ON_Internal_DamagedMarker::~ON_Internal_DamagedMarker
                            ((ON_Internal_DamagedMarker *)&vit);
                }
                else {
LAB_005d6046:
                  vit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)pOVar11;
                  bVar7 = ON_SubDIsNotValid(bSilentError);
                  ON_Internal_DamagedMarker::~ON_Internal_DamagedMarker
                            ((ON_Internal_DamagedMarker *)&vit);
                  if (!bVar7) goto LAB_005d6067;
                }
                local_a8 = &pOVar11->m_next_vertex;
              }
              while (pOVar21 = *local_98, pOVar21 != (ON_SubDEdge *)0x0) {
                ON_3dPoint::ON_3dPoint((ON_3dPoint *)&vit,pOVar21->m_vertex[0]->m_P);
                ON_3dPoint::ON_3dPoint((ON_3dPoint *)&vit.m_v_last,pOVar21->m_vertex[1]->m_P);
                bVar7 = ON_3dPoint::operator!=((ON_3dPoint *)&vit,(ON_3dPoint *)&vit.m_v_last);
                if (!bVar7) {
                  ON_ComponentStatus::SetDamagedState
                            (&(pOVar21->super_ON_SubDComponentBase).m_status,true);
                  goto LAB_005d58fa;
                }
                local_98 = &pOVar21->m_next_edge;
              }
              local_c0._0_1_ = 1;
              goto LAB_005d6070;
            }
          }
        }
      }
    }
  }
LAB_005d58fa:
  local_c0._0_1_ = ON_SubDIsNotValid(bSilentError);
LAB_005d6070:
  return (bool)((byte)local_c0 & 1);
LAB_005d6067:
  local_c0._0_1_ = 0;
  goto LAB_005d6070;
}

Assistant:

bool ON_SubDimple::IsValidLevel(
  const ON_SubD& subd,
  unsigned int level_index,
  bool bSilentError,
  ON_TextLog* text_log
  ) const
{
  const unsigned int level_count = m_levels.UnsignedCount();
  if (level_index >= level_count || level_index >= 0xFFFF)
    return ON_SubDIsNotValid(bSilentError);
  const ON_SubDLevel* level = m_levels[level_index];
  if ( nullptr == level)
    return ON_SubDIsNotValid(bSilentError);
  level->ClearComponentDamagedState();

  if ( level->m_level_index != level_index)
    return ON_SubDIsNotValid(bSilentError);

  if (level_index <= 0)
  {
    if (level->m_vertex_count < 3)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_edge_count < 3)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_face_count < 1)
      return ON_SubDIsNotValid(bSilentError);
  }
  else
  {
    const ON_SubDLevel* previous_level = m_levels[level_index - 1];
    if (nullptr == previous_level)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_vertex_count <= previous_level->m_vertex_count)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_edge_count <= previous_level->m_edge_count)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_face_count <= previous_level->m_face_count)
      return ON_SubDIsNotValid(bSilentError);
  }

  if (nullptr == level->m_vertex[0])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_edge[0])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_face[0])
    return ON_SubDIsNotValid(bSilentError);

  if (nullptr == level->m_vertex[1])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_edge[1])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_face[1])
    return ON_SubDIsNotValid(bSilentError);


  const unsigned short expected_level = (unsigned short)level_index;
  unsigned int i;
  const ON_SubDVertex* vertex;
  const ON_SubDEdge* edge;
  const ON_SubDFace* face;

  unsigned int v_id_range[2] = { ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX };
  unsigned int e_id_range[2] = { ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX };
  unsigned int f_id_range[2] = { ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX };

  unsigned int point_vertex_count = 0;
  unsigned int wire_edge_count = 0;

  // simple vertex validation
  if (level_index == subd.ActiveLevelIndex())
  {
    if (subd.FirstVertex() != level->m_vertex[0])
      return ON_SubDIsNotValid(bSilentError);
    ON_SubDVertexIterator vit = subd.VertexIterator();
    if (vit.FirstVertex() != level->m_vertex[0])
      return ON_SubDIsNotValid(bSilentError);
    // IsValid() should not create these clunky cached arrays.
    //ON_SubDVertexArray va = subd.VertexArray();
    //if (va.VertexCount() != level->m_vertex_count)
    //  return ON_SubDIsNotValid(bSilentError);
    //if (va[0] != level->m_vertex[0])
    //  return ON_SubDIsNotValid(bSilentError);
    //if (va[level->m_vertex_count-1] != level->m_vertex[1])
    //  return ON_SubDIsNotValid(bSilentError);
  }
  const ON_SubDVertex* last_vertex = nullptr;
  for (i = 0, vertex = level->m_vertex[0]; i < level->m_vertex_count && nullptr != vertex; i++, vertex = vertex->m_next_vertex)
  {
    if (false == IsValidSubDVertex(vertex, expected_level, nullptr, level->m_ordinary_vertex_valence, bSilentError))
      return false;

    if (0 == i)
    {
      v_id_range[0] = v_id_range[1] = vertex->m_id;
    }
    else if (vertex->m_id < v_id_range[0])
      v_id_range[0] = vertex->m_id;
    else if (vertex->m_id > v_id_range[1])
      v_id_range[1] = vertex->m_id;

    if (0 == vertex->m_edge_count)
    {
      point_vertex_count++;
    }
    last_vertex = vertex;
  }
  if (level->m_vertex[1] != last_vertex)
    return ON_SubDIsNotValid(bSilentError);


  if (i != level->m_vertex_count || nullptr != vertex)
    return ON_SubDIsNotValid(bSilentError);
  if (1 + v_id_range[1] - v_id_range[0] < level->m_vertex_count)
    return ON_SubDIsNotValid(bSilentError);
  if ( v_id_range[1] > MaximumVertexId() )
    return ON_SubDIsNotValid(bSilentError);

  // currently, point vertices are not permitted
  if (point_vertex_count > 0)
    return ON_SubDIsNotValid(bSilentError);

  // simple edge validation
  if (level_index == subd.ActiveLevelIndex())
  {
    if (subd.FirstEdge() != level->m_edge[0])
      return ON_SubDIsNotValid(bSilentError);
    ON_SubDEdgeIterator eit = subd.EdgeIterator();
    if (eit.FirstEdge() != level->m_edge[0])
      return ON_SubDIsNotValid(bSilentError);

    // IsValid() should not create these clunky cached arrays.
    //ON_SubDEdgeArray ea = subd.EdgeArray();
    //if (ea.EdgeCount() != level->m_edge_count)
    //  return ON_SubDIsNotValid(bSilentError);
    //if (ea[0] != level->m_edge[0])
    //  return ON_SubDIsNotValid(bSilentError);
    //if (ea[level->m_edge_count-1] != level->m_edge[1])
    //  return ON_SubDIsNotValid(bSilentError);
  }
  const ON_SubDEdge* last_edge = nullptr;
  for (i = 0, edge = level->m_edge[0]; i < level->m_edge_count && nullptr != edge; i++, edge = edge->m_next_edge)
  {
    if (false == IsValidSubDEdge(edge, expected_level, nullptr, bSilentError))
      return false;
    if (0 == edge->m_face_count)
    {
      wire_edge_count++;
    }
    if (0 == i)
    {
      e_id_range[0] = e_id_range[1] = edge->m_id;
    }
    else if (edge->m_id < e_id_range[0])
      e_id_range[0] = edge->m_id;
    else if (edge->m_id > e_id_range[1])
      e_id_range[1] = edge->m_id;

    last_edge = edge;
  }
  if (i != level->m_edge_count || nullptr != edge)
    return ON_SubDIsNotValid(bSilentError);
  if (1 + e_id_range[1] - e_id_range[0] < level->m_edge_count)
    return ON_SubDIsNotValid(bSilentError);
  if (level->m_edge[1] != last_edge)
    return ON_SubDIsNotValid(bSilentError);
  if ( e_id_range[1] > MaximumEdgeId() )
    return ON_SubDIsNotValid(bSilentError);
   
  // As of November 12, 2019
  // Wire edges are permitted. THey exist in subds being edited.
  ////// currently, wire edges are not permitted
  ////if (wire_edge_count > 0)
  ////  return ON_SubDIsNotValid(bSilentError);
   
  // simple face validation
  if (level_index == subd.ActiveLevelIndex())
  {
    if (subd.FirstFace() != level->m_face[0])
      return ON_SubDIsNotValid(bSilentError);
    ON_SubDFaceIterator fit = subd.FaceIterator();
    if (fit.FirstFace() != level->m_face[0])
      return ON_SubDIsNotValid(bSilentError);
    // IsValid() should not create these clunky cached arrays.
    //ON_SubDFaceArray fa = subd.FaceArray();
    //if (fa.FaceCount() != level->m_face_count)
    //  return ON_SubDIsNotValid(bSilentError);
    //if (fa[0] != level->m_face[0])
    //  return ON_SubDIsNotValid(bSilentError);
    //if (fa[0] != level->m_face[0])
    //  return ON_SubDIsNotValid(bSilentError);
  }
  const ON_SubDFace* last_face = nullptr;
  for (i = 0, face = level->m_face[0]; i < level->m_face_count && nullptr != face; i++, face = face->m_next_face)
  {
    if (false == IsValidSubDFace(face, expected_level, nullptr, level->m_ordinary_face_edge_count, bSilentError))
      return false;

    if (0 == i)
    {
      f_id_range[0] = f_id_range[1] = face->m_id;
    }
    else if (face->m_id < f_id_range[0])
      f_id_range[0] = face->m_id;
    else if (face->m_id > f_id_range[1])
      f_id_range[1] = face->m_id;

    last_face = face;
  }
  if (i != level->m_face_count || nullptr != face)
    return ON_SubDIsNotValid(bSilentError);
  if (1 + f_id_range[1] - f_id_range[0] < level->m_face_count)
    return ON_SubDIsNotValid(bSilentError);  
  if (level->m_face[1] != last_face)
    return ON_SubDIsNotValid(bSilentError);
  if ( f_id_range[1] > MaximumFaceId() )
    return ON_SubDIsNotValid(bSilentError);


  // vertex topology validation
  for (vertex = level->m_vertex[0]; nullptr != vertex; vertex = vertex->m_next_vertex)
  {
    for (i = 0; i < vertex->m_edge_count; i++)
    {
      edge = vertex->Edge(i);
      if (false == IsValidSubDEdge(edge, expected_level, e_id_range, bSilentError))
        return false;
      if (false == IsValidVertexEdgeLink(vertex, edge, vertex->EdgeDirection(i), bSilentError))
        return false;
    }

    for (i = 0; i < vertex->m_face_count; i++)
    {
      face = vertex->Face(i);
      if (false == IsValidSubDFace(face, expected_level, f_id_range, level->m_ordinary_face_edge_count, bSilentError))
        return false;
      if (false == IsValidVertexFaceLink(vertex, face, i, ON_UNSET_UINT_INDEX, bSilentError))
        return false;
    }
  }

  // edge topology validation
  for (edge = level->m_edge[0]; nullptr != edge; edge = edge->m_next_edge)
  {
    for (i = 0; i < 2; i++)
    {
      vertex = edge->m_vertex[i];
      if (false == IsValidSubDVertex(vertex, expected_level, v_id_range, level->m_ordinary_vertex_valence, bSilentError))
        return false;
      if (false == IsValidVertexEdgeLink(vertex, edge, i, bSilentError))
        return false;
    }

    for (i = 0; i < edge->m_face_count; i++)
    {
      face = edge->Face(i);
      if (false == IsValidSubDFace(face, expected_level, f_id_range, level->m_ordinary_face_edge_count, bSilentError))
        return false;
      if (false == IsValidEdgeFaceLink(edge, face, i, ON_UNSET_UINT_INDEX, bSilentError))
        return false;
    }
  }

  // face topology validation
  for (face = level->m_face[0]; nullptr != face; face = face->m_next_face)
  {
    for (i = 0; i < face->m_edge_count; i++)
    {
      edge = face->Edge(i);
      if (false == IsValidSubDEdge(edge, expected_level, e_id_range, bSilentError))
        return false;
      if (false == IsValidEdgeFaceLink(edge, face, ON_UNSET_UINT_INDEX, i, bSilentError))
        return false;
    }

    for (i = 0; i < face->m_edge_count; i++)
    {
      vertex = face->Vertex(i);
      if (false == IsValidSubDVertex(vertex, expected_level, v_id_range, level->m_ordinary_vertex_valence, bSilentError))
        return false;
      if (false == IsValidVertexFaceLink(vertex, face, ON_UNSET_UINT_INDEX, i, bSilentError))
        return false;
    }
  }


  // edge tag validation
  for (edge = level->m_edge[0]; nullptr != edge; edge = edge->m_next_edge)
  {
    if (false == IsValidSubDEdgeTag(edge, bSilentError))
      return false;
  }

  // vertex tag validation
  for (vertex = level->m_vertex[0]; nullptr != vertex; vertex = vertex->m_next_vertex)
  {
    if (false == IsValidSubDVertexTag(vertex, bSilentError))
      return false;
  }

  // edge length validation
  for (edge = level->m_edge[0]; nullptr != edge; edge = edge->m_next_edge)
  {
    const ON_3dPoint P[2] = { edge->m_vertex[0]->ControlNetPoint(), edge->m_vertex[1]->ControlNetPoint() };
    if (false == (P[0] != P[1]))
    {
      edge->m_status.SetDamagedState(true);
      return ON_SubDIsNotValid(bSilentError);
    }
  }


  return true;
}